

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.c
# Opt level: O3

uint64_t unpackLE64(uint8_t *p,uint8_t u8Size)

{
  uint64_t value;
  uint64_t local_10;
  
  if ((byte)(u8Size - 1) < 8) {
    local_10 = 0;
    memcpy(&local_10,p,(ulong)u8Size);
    return local_10;
  }
  return 0;
}

Assistant:

_PACK_UINT64 unpackLE64(const _PACK_UINT8* p, _PACK_UINT8 u8Size)
{
   if ((u8Size > 0) && (u8Size <= sizeof(_PACK_UINT64)))
   {
#if defined(PLATFORM_BYTE_ORDER) && (PLATFORM_BYTE_ORDER==PLATFORM_LITTLE_ENDIAN)
      _PACK_UINT64 value = 0u;
      memcpy(&value, p, u8Size);
      return value;
#else
      _PACK_UINT64 tmp = 0;
      p += (u8Size - 1);
      while (u8Size > 0)
      {
         tmp = (tmp << 8) | *(p--);
         u8Size--;
      }
      return tmp;
#endif
   }
   return 0;
}